

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void av1_post_encode_updates(AV1_COMP *cpi,AV1_COMP_DATA *cpi_data)

{
  AV1_COMMON *cm;
  FIRSTPASS_INFO *firstpass_info;
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  AV1_PRIMARY *pAVar5;
  FIRSTPASS_STATS *pFVar6;
  FIRSTPASS_STATS *pFVar7;
  SequenceHeader *pSVar8;
  RefCntBuffer *pRVar9;
  RefCntBuffer *pRVar10;
  double dVar11;
  RefCntBuffer *pRVar12;
  RefCntBuffer *pRVar13;
  RefCntBuffer *pRVar14;
  RefCntBuffer *pRVar15;
  RefCntBuffer *pRVar16;
  int64_t iVar17;
  uchar uVar18;
  uchar uVar19;
  int i;
  int iVar20;
  aom_enc_pass aVar21;
  uint uVar22;
  ulong uVar23;
  int *piVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  MV_STATS *pMVar28;
  AV1_PRIMARY *pAVar29;
  MV_STATS *pMVar30;
  byte bVar31;
  PSNR_STATS psnr;
  aom_codec_cx_pkt pkt;
  
  bVar31 = 0;
  pAVar5 = cpi->ppi;
  cm = &cpi->common;
  uVar23 = (ulong)cpi->gf_frame_index;
  bVar4 = (pAVar5->gf_group).update_type[uVar23];
  uVar22 = 1;
  lVar25 = 0x41f04;
  do {
    if (lVar25 + 0x24 == 0x42048) {
      uVar22 = 0;
      break;
    }
    pcVar1 = (char *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar25);
    lVar25 = lVar25 + 0x24;
  } while (*pcVar1 == '\0');
  uVar26 = 0;
  if (pAVar5->valid_gm_model_found[bVar4] != 0x7fffffff) {
    uVar26 = pAVar5->valid_gm_model_found[bVar4];
  }
  pAVar5->valid_gm_model_found[bVar4] = uVar26 | uVar22;
  pFVar6 = (cpi->twopass_frame).this_frame;
  if ((pFVar6 != (FIRSTPASS_STATS *)0x0) &&
     (pFVar7 = ((pAVar5->twopass).stats_buf_ctx)->total_left_stats, pFVar7 != (FIRSTPASS_STATS *)0x0
     )) {
    dVar11 = pFVar6->weight;
    pFVar7->frame = pFVar7->frame - pFVar6->frame;
    pFVar7->weight = pFVar7->weight - dVar11;
    dVar11 = pFVar6->frame_avg_wavelet_energy;
    pFVar7->intra_error = pFVar7->intra_error - pFVar6->intra_error;
    pFVar7->frame_avg_wavelet_energy = pFVar7->frame_avg_wavelet_energy - dVar11;
    dVar11 = pFVar6->sr_coded_error;
    pFVar7->coded_error = pFVar7->coded_error - pFVar6->coded_error;
    pFVar7->sr_coded_error = pFVar7->sr_coded_error - dVar11;
    dVar11 = pFVar6->pcnt_motion;
    pFVar7->pcnt_inter = pFVar7->pcnt_inter - pFVar6->pcnt_inter;
    pFVar7->pcnt_motion = pFVar7->pcnt_motion - dVar11;
    dVar11 = pFVar6->pcnt_neutral;
    pFVar7->pcnt_second_ref = pFVar7->pcnt_second_ref - pFVar6->pcnt_second_ref;
    pFVar7->pcnt_neutral = pFVar7->pcnt_neutral - dVar11;
    dVar11 = pFVar6->inactive_zone_rows;
    pFVar7->intra_skip_pct = pFVar7->intra_skip_pct - pFVar6->intra_skip_pct;
    pFVar7->inactive_zone_rows = pFVar7->inactive_zone_rows - dVar11;
    dVar11 = pFVar6->MVr;
    pFVar7->inactive_zone_cols = pFVar7->inactive_zone_cols - pFVar6->inactive_zone_cols;
    pFVar7->MVr = pFVar7->MVr - dVar11;
    dVar11 = pFVar6->MVc;
    pFVar7->mvr_abs = pFVar7->mvr_abs - pFVar6->mvr_abs;
    pFVar7->MVc = pFVar7->MVc - dVar11;
    dVar11 = pFVar6->MVrv;
    pFVar7->mvc_abs = pFVar7->mvc_abs - pFVar6->mvc_abs;
    pFVar7->MVrv = pFVar7->MVrv - dVar11;
    dVar11 = pFVar6->mv_in_out_count;
    pFVar7->MVcv = pFVar7->MVcv - pFVar6->MVcv;
    pFVar7->mv_in_out_count = pFVar7->mv_in_out_count - dVar11;
    pFVar7->count = pFVar7->count - pFVar6->count;
    dVar11 = pFVar6->duration;
    pFVar7->new_mv_count = pFVar7->new_mv_count - pFVar6->new_mv_count;
    pFVar7->duration = pFVar7->duration - dVar11;
  }
  if ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
     (cpi->is_dropped_frame == false)) {
    if ((((pAVar5->gf_group).frame_parallel_level[uVar23] == 2) &&
        ((pAVar5->gf_group).frame_parallel_level[uVar23 - 1] == 1)) &&
       ((pAVar5->gf_group).update_type[uVar23 - 1] == '\x06')) {
      pRVar9 = pAVar5->ref_frame_map_copy[0];
      pRVar10 = pAVar5->ref_frame_map_copy[1];
      pRVar12 = pAVar5->ref_frame_map_copy[2];
      pRVar13 = pAVar5->ref_frame_map_copy[3];
      pRVar14 = pAVar5->ref_frame_map_copy[4];
      pRVar15 = pAVar5->ref_frame_map_copy[5];
      pRVar16 = pAVar5->ref_frame_map_copy[7];
      (cpi->common).ref_frame_map[6] = pAVar5->ref_frame_map_copy[6];
      (cpi->common).ref_frame_map[7] = pRVar16;
      (cpi->common).ref_frame_map[4] = pRVar14;
      (cpi->common).ref_frame_map[5] = pRVar15;
      (cpi->common).ref_frame_map[2] = pRVar12;
      (cpi->common).ref_frame_map[3] = pRVar13;
      (cpi->common).ref_frame_map[0] = pRVar9;
      (cpi->common).ref_frame_map[1] = pRVar10;
    }
    pSVar8 = (cpi->common).seq_params;
    iVar20 = is_one_pass_rt_params(cpi);
    lVar25 = 8;
    if (((iVar20 != 0) && (pAVar5->number_spatial_layers == 1)) &&
       ((pAVar5->number_temporal_layers == 1 &&
        (((pAVar5->rtc_ref).set_ref_frame_config == 0 &&
         ((pSVar8->order_hint_info).enable_order_hint == 0)))))) {
      lVar25 = (ulong)(cpi->rt_reduce_num_ref_buffers == 0) + 7;
    }
    uVar22 = (cpi->common).current_frame.refresh_frame_flags;
    for (lVar27 = 0; lVar25 != lVar27; lVar27 = lVar27 + 1) {
      if ((uVar22 >> ((uint)lVar27 & 0x1f) & 1) != 0) {
        pRVar9 = (cpi->common).cur_frame;
        pRVar10 = (cpi->common).ref_frame_map[lVar27];
        if (pRVar10 != (RefCntBuffer *)0x0) {
          pRVar10->ref_count = pRVar10->ref_count + -1;
        }
        (cpi->common).ref_frame_map[lVar27] = pRVar9;
        pRVar9->ref_count = pRVar9->ref_count + 1;
      }
    }
    if (((pAVar5->gf_group).frame_parallel_level[uVar23] == 1) &&
       ((pAVar5->gf_group).update_type[uVar23] == '\x06')) {
      pRVar9 = (cpi->common).ref_frame_map[0];
      pRVar10 = (cpi->common).ref_frame_map[1];
      pRVar12 = (cpi->common).ref_frame_map[2];
      pRVar13 = (cpi->common).ref_frame_map[3];
      pRVar14 = (cpi->common).ref_frame_map[4];
      pRVar15 = (cpi->common).ref_frame_map[5];
      pRVar16 = (cpi->common).ref_frame_map[7];
      pAVar5->ref_frame_map_copy[6] = (cpi->common).ref_frame_map[6];
      pAVar5->ref_frame_map_copy[7] = pRVar16;
      pAVar5->ref_frame_map_copy[4] = pRVar14;
      pAVar5->ref_frame_map_copy[5] = pRVar15;
      pAVar5->ref_frame_map_copy[2] = pRVar12;
      pAVar5->ref_frame_map_copy[3] = pRVar13;
      pAVar5->ref_frame_map_copy[0] = pRVar9;
      pAVar5->ref_frame_map_copy[1] = pRVar10;
    }
    av1_rc_postencode_update(cpi,cpi_data->frame_size);
  }
  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead,cpi_data->flush,cpi->compressor_stage);
  }
  if ((cpi->common).show_frame != 0) {
    pAVar29 = cpi->ppi;
    iVar17 = cpi_data->ts_frame_end;
    pAVar29->ts_start_last_show_frame = cpi_data->ts_frame_start;
    pAVar29->ts_end_last_show_frame = iVar17;
  }
  aVar21 = (cpi->oxcf).pass;
  if ((pAVar5->level_params).keep_level_stats == 0) {
LAB_001af08d:
    if (aVar21 == AOM_RC_FIRST_PASS) goto LAB_001af2c3;
  }
  else {
    if (aVar21 == AOM_RC_FIRST_PASS) goto LAB_001af2c3;
    if (cpi->compressor_stage != '\x01') {
      if (((cm->current_frame).frame_type == '\0') &&
         ((pAVar5->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
        av1_init_level_info(cpi);
      }
      av1_update_level_info
                (cpi,cpi_data->frame_size,cpi_data->ts_frame_start,cpi_data->ts_frame_end);
      aVar21 = (cpi->oxcf).pass;
      goto LAB_001af08d;
    }
  }
  if (cpi->compressor_stage == '\x01') goto LAB_001af2c3;
  if ((aVar21 != AOM_RC_ONE_PASS) || (pAVar29 = cpi->ppi, pAVar29->lap_enabled != 0)) {
    av1_twopass_postencode_update(cpi);
    pAVar29 = cpi->ppi;
  }
  uVar23 = (ulong)(uint)(pAVar29->gf_group).layer_depth[cpi->gf_frame_index];
  if (uVar23 < 8) {
    lVar25 = *(long *)(&DAT_00437010 + uVar23 * 8);
  }
  else {
    lVar25 = 7;
  }
  bVar4 = (cm->current_frame).frame_type;
  if ((((bVar4 & 0xfd) == 0) || ((cpi->common).features.error_resilient_mode != false)) ||
     ((cpi->ext_flags).use_primary_ref_none == true)) {
    for (lVar27 = 0; lVar27 != 8; lVar27 = lVar27 + 1) {
      pAVar5->fb_of_context_type[lVar27] = -1;
    }
    piVar24 = (cpi->common).remapped_ref_idx + 3;
    if ((cpi->common).show_frame == 0) {
      piVar24 = (cpi->common).remapped_ref_idx + 6;
    }
    pAVar5->fb_of_context_type[lVar25] = *piVar24;
  }
  iVar20 = encode_show_existing_frame(cm);
  if (iVar20 == 0) {
    if (bVar4 == 0) {
      uVar22 = 0;
LAB_001af161:
      pAVar5->fb_of_context_type[lVar25] = uVar22;
    }
    else {
      for (uVar22 = 0; uVar22 != 8; uVar22 = uVar22 + 1) {
        if (((uint)(cpi->common).current_frame.refresh_frame_flags >> (uVar22 & 0x1f) & 1) != 0)
        goto LAB_001af161;
      }
    }
  }
  if ((cpi->common).show_frame == 0) {
LAB_001af1d8:
    if ((pAVar29->rtc_ref).set_ref_frame_config == 0) {
      if ((((cpi->ext_flags).refresh_frame.update_pending == true) &&
          ((cpi->ext_flags).refresh_frame.alt_ref_frame == false)) &&
         (((cpi->ext_flags).refresh_frame.alt2_ref_frame == false &&
          (((cpi->ext_flags).refresh_frame.bwd_ref_frame == false &&
           ((cpi->ext_flags).refresh_frame.golden_frame == false)))))) {
        uVar22 = (cpi->ext_flags).refresh_frame.last_frame ^ 1;
        goto LAB_001af1e9;
      }
    }
    else {
      uVar22 = (pAVar29->rtc_ref).non_reference_frame;
LAB_001af1e9:
      if (uVar22 != 0) goto LAB_001af1ed;
    }
  }
  else {
    if ((cpi->rc).frames_to_key != 0) {
      firstpass_info = &(pAVar29->twopass).firstpass_info;
      if ((pAVar29->twopass).firstpass_info.past_stats_count < 2) {
        av1_firstpass_info_move_cur_index(firstpass_info);
      }
      else {
        av1_firstpass_info_move_cur_index_and_pop(firstpass_info);
      }
      if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
        uVar2 = (cpi->rc).frames_to_key;
        uVar3 = (cpi->rc).frames_since_key;
        (cpi->rc).frames_to_key = uVar2 + -1;
        (cpi->rc).frames_since_key = uVar3 + 1;
        piVar24 = &(cpi->rc).frames_to_fwd_kf;
        *piVar24 = *piVar24 + -1;
        piVar24 = &(cpi->rc).frames_since_scene_change;
        *piVar24 = *piVar24 + 1;
      }
    }
    if ((cpi->common).show_frame == 0) {
      pAVar29 = cpi->ppi;
      goto LAB_001af1d8;
    }
LAB_001af1ed:
    iVar20 = (cpi->rc).frames_till_gf_update_due;
    if (0 < iVar20) {
      (cpi->rc).frames_till_gf_update_due = iVar20 + -1;
    }
  }
  iVar20 = is_one_pass_rt_params(cpi);
  if (iVar20 == 0) {
    uVar18 = cpi->gf_frame_index;
LAB_001af268:
    uVar19 = uVar18 + '\x01';
  }
  else {
    uVar18 = cpi->gf_frame_index;
    if ((cpi->svc).spatial_layer_id != (cpi->svc).number_spatial_layers + -1) goto LAB_001af268;
    uVar19 = uVar18 + '\x01';
    if ((uchar)(uVar18 + '\x01') == 0xfa) {
      uVar19 = '\0';
    }
  }
  cpi->gf_frame_index = uVar19;
  if (cpi->do_frame_data_update == false) {
    pAVar29 = cpi->ppi;
  }
  else {
    pAVar29 = cpi->ppi;
    if ((cpi->common).show_existing_frame == 0) {
      pAVar29->filter_level[0] = (cpi->common).lf.backup_filter_level[0];
      pAVar29->filter_level[1] = (cpi->common).lf.backup_filter_level[1];
      iVar20 = (cpi->common).lf.backup_filter_level_v;
      pAVar29->filter_level_u = (cpi->common).lf.backup_filter_level_u;
      pAVar29->filter_level_v = iVar20;
    }
  }
  pMVar28 = &cpi->mv_stats;
  pMVar30 = &pAVar29->mv_stats;
  for (lVar25 = 0x4c; lVar25 != 0; lVar25 = lVar25 + -1) {
    *(char *)&pMVar30->high_prec = (char)pMVar28->high_prec;
    pMVar28 = (MV_STATS *)((long)pMVar28 + (ulong)bVar31 * -2 + 1);
    pMVar30 = (MV_STATS *)((long)pMVar30 + (ulong)bVar31 * -2 + 1);
  }
LAB_001af2c3:
  if (((pAVar5->rtc_ref).set_ref_frame_config != 0) && (cpi->is_dropped_frame == false)) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }
  if (pAVar5->use_svc != 0) {
    av1_save_layer_context(cpi);
  }
  if (((pAVar5->b_calculate_psnr != 0) && (cpi_data->frame_size != 0)) &&
     (((cpi->common).show_existing_frame != 0 ||
      ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS && (cpi->compressor_stage != '\x01')) &&
       ((cpi->common).show_frame != 0)))))) {
    uVar22 = (cpi->oxcf).input_cfg.input_bit_depth;
    uVar26 = (cpi->td).mb.e_mbd.bd;
    aom_calc_highbd_psnr(cpi->source,&((cpi->common).cur_frame)->buf,&psnr,uVar26,uVar22);
    for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 4) {
      *(undefined4 *)((long)&pkt.data + lVar25) = *(undefined4 *)((long)psnr.samples + lVar25);
      *(undefined8 *)((long)&pkt.data + lVar25 * 2 + 0x10) =
           *(undefined8 *)((long)psnr.sse + lVar25 * 2);
      *(undefined8 *)((long)&pkt.data + lVar25 * 2 + 0x30) =
           *(undefined8 *)((long)psnr.psnr + lVar25 * 2);
    }
    if ((uVar22 < uVar26) && ((cpi->source->flags & 8U) != 0)) {
      for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 4) {
        *(undefined4 *)((long)&pkt.data + lVar25 + 0x50) =
             *(undefined4 *)((long)psnr.samples_hbd + lVar25);
        *(undefined8 *)((long)&pkt.data + lVar25 * 2 + 0x60) =
             *(undefined8 *)((long)psnr.sse_hbd + lVar25 * 2);
        *(undefined8 *)((long)&pkt.data + lVar25 * 2 + 0x80) =
             *(undefined8 *)((long)psnr.psnr_hbd + lVar25 * 2);
      }
    }
    pkt.kind = AOM_CODEC_PSNR_PKT;
    aom_codec_pkt_list_add(cpi->ppi->output_pkt_list,&pkt);
  }
  return;
}

Assistant:

void av1_post_encode_updates(AV1_COMP *const cpi,
                             const AV1_COMP_DATA *const cpi_data) {
  AV1_PRIMARY *const ppi = cpi->ppi;
  AV1_COMMON *const cm = &cpi->common;

  update_gm_stats(cpi);

#if !CONFIG_REALTIME_ONLY
  // Update the total stats remaining structure.
  if (cpi->twopass_frame.this_frame != NULL &&
      ppi->twopass.stats_buf_ctx->total_left_stats) {
    subtract_stats(ppi->twopass.stats_buf_ctx->total_left_stats,
                   cpi->twopass_frame.this_frame);
  }
#endif

#if CONFIG_OUTPUT_FRAME_SIZE
  FILE *f = fopen("frame_sizes.csv", "a");
  fprintf(f, "%d,", 8 * (int)cpi_data->frame_size);
  fprintf(f, "%d\n", cm->quant_params.base_qindex);
  fclose(f);
#endif  // CONFIG_OUTPUT_FRAME_SIZE

  if (!is_stat_generation_stage(cpi) && !cpi->is_dropped_frame) {
    // Before calling refresh_reference_frames(), copy ppi->ref_frame_map_copy
    // to cm->ref_frame_map for frame_parallel_level 2 frame in a parallel
    // encode set of lower layer frames.
    // TODO(Remya): Move ref_frame_map from AV1_COMMON to AV1_PRIMARY to avoid
    // copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 2 &&
        ppi->gf_group.frame_parallel_level[cpi->gf_frame_index - 1] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index - 1] ==
            INTNL_ARF_UPDATE) {
      memcpy(cm->ref_frame_map, ppi->ref_frame_map_copy,
             sizeof(cm->ref_frame_map));
    }
    refresh_reference_frames(cpi);
    // For frame_parallel_level 1 frame in a parallel encode set of lower layer
    // frames, store the updated cm->ref_frame_map in ppi->ref_frame_map_copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
      memcpy(ppi->ref_frame_map_copy, cm->ref_frame_map,
             sizeof(cm->ref_frame_map));
    }
    av1_rc_postencode_update(cpi, cpi_data->frame_size);
  }

  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead, cpi_data->flush,
                      cpi->compressor_stage);
  }
  if (cpi->common.show_frame) {
    cpi->ppi->ts_start_last_show_frame = cpi_data->ts_frame_start;
    cpi->ppi->ts_end_last_show_frame = cpi_data->ts_frame_end;
  }
  if (ppi->level_params.keep_level_stats && !is_stat_generation_stage(cpi)) {
    // Initialize level info. at the beginning of each sequence.
    if (cm->current_frame.frame_type == KEY_FRAME &&
        ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      av1_init_level_info(cpi);
    }
    av1_update_level_info(cpi, cpi_data->frame_size, cpi_data->ts_frame_start,
                          cpi_data->ts_frame_end);
  }

  if (!is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (!has_no_stats_stage(cpi)) av1_twopass_postencode_update(cpi);
#endif
    update_fb_of_context_type(cpi, ppi->fb_of_context_type);
    update_rc_counts(cpi);
    update_end_of_frame_stats(cpi);
  }

#if CONFIG_THREE_PASS
  if (cpi->oxcf.pass == AOM_RC_THIRD_PASS && cpi->third_pass_ctx) {
    av1_pop_third_pass_info(cpi->third_pass_ctx);
  }
#endif

  if (ppi->rtc_ref.set_ref_frame_config && !cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }

  if (ppi->use_svc) av1_save_layer_context(cpi);

  // Note *size = 0 indicates a dropped frame for which psnr is not calculated
  if (ppi->b_calculate_psnr && cpi_data->frame_size > 0) {
    if (cm->show_existing_frame ||
        (!is_stat_generation_stage(cpi) && cm->show_frame)) {
      generate_psnr_packet(cpi);
    }
  }

#if CONFIG_INTERNAL_STATS
  if (!is_stat_generation_stage(cpi)) {
    compute_internal_stats(cpi, (int)cpi_data->frame_size);
  }
#endif  // CONFIG_INTERNAL_STATS

#if CONFIG_THREE_PASS
  // Write frame info. Subtract 1 from frame index since if was incremented in
  // update_rc_counts.
  av1_write_second_pass_per_frame_info(cpi, cpi->gf_frame_index - 1);
#endif
}